

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void SaveOpndValue(ParseNode *pnode,FuncInfo *funcInfo)

{
  Symbol *pSVar1;
  RegSlot RVar2;
  ParseNodeUni *pPVar3;
  ParseNodeName *pPVar4;
  ParseNodePtr this;
  
  this = pnode;
  if (pnode->nop != knopName) {
    if (pnode->nop != knopComputedName) {
      return;
    }
    pPVar3 = ParseNode::AsParseNodeUni(pnode);
    this = pPVar3->pnode1;
    if (this->nop != knopName) {
      return;
    }
  }
  pPVar4 = ParseNode::AsParseNodeName(this);
  pSVar1 = pPVar4->sym;
  if ((((pSVar1 != (Symbol *)0x0) && (pnode->location != 0xffffffff)) &&
      (pSVar1->scope->func == funcInfo)) && (pnode->location == pSVar1->location)) {
    RVar2 = FuncInfo::AcquireTmpRegister(funcInfo);
    pnode->location = RVar2;
  }
  return;
}

Assistant:

void SaveOpndValue(ParseNode *pnode, FuncInfo *funcInfo)
{
    // Save a local name to a register other than its home location.
    // This guards against side-effects in cases like x.foo(x = bar()).
    Symbol *sym = nullptr;
    if (pnode->nop == knopName)
    {
        sym = pnode->AsParseNodeName()->sym;
    }
    else if (pnode->nop == knopComputedName)
    {
        ParseNode *pnode1 = pnode->AsParseNodeUni()->pnode1;
        if (pnode1->nop == knopName)
        {
            sym = pnode1->AsParseNodeName()->sym;
        }
    }

    if (sym == nullptr)
    {
        return;
    }

    // If the target is a local being kept in its home location,
    // protect the target's value in the event the home location is overwritten.
    if (pnode->location != Js::Constants::NoRegister &&
        sym->GetScope()->GetFunc() == funcInfo &&
        pnode->location == sym->GetLocation())
    {
        pnode->location = funcInfo->AcquireTmpRegister();
    }
}